

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

const_reference __thiscall
duckdb::vector<bool,_true>::get<true>(vector<bool,_true> *this,size_type __n)

{
  const_reference cVar1;
  
  AssertIndexInBounds(__n,(ulong)*(uint *)(this + 0x18) +
                          (*(long *)(this + 0x10) - *(long *)this) * 8);
  cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)this,__n);
  return cVar1;
}

Assistant:

inline typename original::const_reference get(typename original::size_type __n) const { // NOLINT: hiding on purpose
		if (MemorySafety<INTERNAL_SAFE>::ENABLED) {
			AssertIndexInBounds(__n, original::size());
		}
		return original::operator[](__n);
	}